

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

int Inv(double *src,double (*dst) [4],double *determinant,double *pivot)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_178;
  int local_170;
  uint local_16c;
  int rank;
  int swapcount;
  int col [4];
  int local_150;
  int local_14c;
  int jx;
  int ix;
  int j;
  int i;
  double d;
  double c;
  double x;
  double I [4] [4];
  double M [4] [4];
  double *pivot_local;
  double *determinant_local;
  double (*dst_local) [4];
  double *src_local;
  
  _rank = 0x100000000;
  col[0] = 2;
  col[1] = 3;
  local_170 = 0;
  *pivot = 0.0;
  *determinant = 0.0;
  memset(&x,0,0x80);
  I[3][2] = 1.0;
  I[2][1] = 1.0;
  I[1][0] = 1.0;
  x = 1.0;
  memcpy(I[3] + 3,src,0x80);
  local_150 = 0;
  local_14c = 0;
  uVar1 = (ulong)DAT_009d3010;
  c = (double)((ulong)I[3][3] & uVar1);
  for (ix = 0; ix < 4; ix = ix + 1) {
    for (jx = 0; jx < 4; jx = jx + 1) {
      if (c < (double)((ulong)I[(long)ix + 3][(long)jx + 3] & uVar1)) {
        local_14c = ix;
        local_150 = jx;
        c = (double)((ulong)I[(long)ix + 3][(long)jx + 3] & uVar1);
      }
    }
  }
  *pivot = c;
  if (local_14c != 0) {
    SwapRow((double (*) [4])(I[3] + 3),0,local_14c);
    SwapRow((double (*) [4])&x,0,local_14c);
  }
  local_16c = (uint)(local_14c != 0);
  if (local_150 != 0) {
    SwapCol((double (*) [4])(I[3] + 3),0,local_150);
    _rank = CONCAT44(1,local_150);
    local_16c = local_16c + 1;
  }
  if (0.0 < c) {
    local_170 = 1;
    dVar3 = M[0][0] / I[3][3];
    M[0][1] = M[0][1] / I[3][3];
    M[0][2] = M[0][2] / I[3][3];
    x = x / I[3][3];
    I[0][0] = I[0][0] / I[3][3];
    I[0][1] = I[0][1] / I[3][3];
    I[0][2] = I[0][2] / I[3][3];
    dVar4 = c * 2.220446049250313e-16;
    if (dVar4 < ABS(M[0][3])) {
      dVar2 = -M[0][3];
      M[1][0] = dVar2 * dVar3 + M[1][0];
      M[1][1] = dVar2 * M[0][1] + M[1][1];
      M[1][2] = dVar2 * M[0][2] + M[1][2];
      AddCxRow((double (*) [4])&x,dVar2,0,1);
    }
    if (dVar4 < ABS(M[1][3])) {
      dVar2 = -M[1][3];
      M[2][0] = dVar2 * dVar3 + M[2][0];
      M[2][1] = dVar2 * M[0][1] + M[2][1];
      M[2][2] = dVar2 * M[0][2] + M[2][2];
      AddCxRow((double (*) [4])&x,dVar2,0,2);
    }
    if (dVar4 < ABS(M[2][3])) {
      dVar4 = -M[2][3];
      M[3][0] = dVar4 * dVar3 + M[3][0];
      M[3][1] = dVar4 * M[0][1] + M[3][1];
      M[3][2] = dVar4 * M[0][2] + M[3][2];
      AddCxRow((double (*) [4])&x,dVar4,0,3);
    }
    local_150 = 1;
    local_14c = 1;
    c = ABS(M[1][0]);
    for (ix = 1; ix < 4; ix = ix + 1) {
      for (jx = 1; jx < 4; jx = jx + 1) {
        if (c < ABS(I[(long)ix + 3][(long)jx + 3])) {
          local_14c = ix;
          local_150 = jx;
          c = ABS(I[(long)ix + 3][(long)jx + 3]);
        }
      }
    }
    if (c < *pivot) {
      *pivot = c;
    }
    if (local_14c != 1) {
      SwapRow((double (*) [4])(I[3] + 3),1,local_14c);
      SwapRow((double (*) [4])&x,1,local_14c);
      local_16c = local_16c + 1;
    }
    if (local_150 != 1) {
      SwapCol((double (*) [4])(I[3] + 3),1,local_150);
      _rank = CONCAT44(local_150,rank);
      local_16c = local_16c + 1;
    }
    if (0.0 < c) {
      local_170 = 2;
      dVar4 = M[1][1] / M[1][0];
      M[1][2] = M[1][2] / M[1][0];
      I[0][3] = I[0][3] / M[1][0];
      I[1][0] = I[1][0] / M[1][0];
      I[1][1] = I[1][1] / M[1][0];
      I[1][2] = I[1][2] / M[1][0];
      dVar2 = c * 2.220446049250313e-16;
      if (dVar2 < ABS(dVar3)) {
        dVar3 = -dVar3;
        M[0][1] = dVar3 * dVar4 + M[0][1];
        M[0][2] = dVar3 * M[1][2] + M[0][2];
        AddCxRow((double (*) [4])&x,dVar3,1,0);
      }
      if (dVar2 < ABS(M[2][0])) {
        dVar3 = -M[2][0];
        M[2][1] = dVar3 * dVar4 + M[2][1];
        M[2][2] = dVar3 * M[1][2] + M[2][2];
        AddCxRow((double (*) [4])&x,dVar3,1,2);
      }
      if (dVar2 < ABS(M[3][0])) {
        dVar3 = -M[3][0];
        M[3][1] = dVar3 * dVar4 + M[3][1];
        M[3][2] = dVar3 * M[1][2] + M[3][2];
        AddCxRow((double (*) [4])&x,dVar3,1,3);
      }
      local_150 = 2;
      local_14c = 2;
      c = ABS(M[2][1]);
      for (ix = 2; ix < 4; ix = ix + 1) {
        for (jx = 2; jx < 4; jx = jx + 1) {
          if (c < ABS(I[(long)ix + 3][(long)jx + 3])) {
            local_14c = ix;
            local_150 = jx;
            c = ABS(I[(long)ix + 3][(long)jx + 3]);
          }
        }
      }
      if (c < *pivot) {
        *pivot = c;
      }
      if (local_14c != 2) {
        SwapRow((double (*) [4])(I[3] + 3),2,local_14c);
        SwapRow((double (*) [4])&x,2,local_14c);
        local_16c = local_16c + 1;
      }
      if (local_150 != 2) {
        SwapCol((double (*) [4])(I[3] + 3),2,local_150);
        col[1] = 3;
        col[0] = local_150;
        local_16c = local_16c + 1;
      }
      if (0.0 < c) {
        local_170 = 3;
        dVar3 = M[2][2] / M[2][1];
        I[1][3] = I[1][3] / M[2][1];
        I[2][0] = I[2][0] / M[2][1];
        I[2][1] = I[2][1] / M[2][1];
        I[2][2] = I[2][2] / M[2][1];
        dVar2 = c * 2.220446049250313e-16;
        if (dVar2 < ABS(M[0][1])) {
          M[0][2] = -M[0][1] * dVar3 + M[0][2];
          AddCxRow((double (*) [4])&x,-M[0][1],2,0);
        }
        if (dVar2 < ABS(dVar4)) {
          M[1][2] = -dVar4 * dVar3 + M[1][2];
          AddCxRow((double (*) [4])&x,-dVar4,2,1);
        }
        if (dVar2 < ABS(M[3][1])) {
          M[3][2] = -M[3][1] * dVar3 + M[3][2];
          AddCxRow((double (*) [4])&x,-M[3][1],2,3);
        }
        dVar4 = ABS(M[3][2]);
        if (dVar4 < *pivot) {
          *pivot = dVar4;
        }
        if (0.0 < dVar4) {
          local_170 = 4;
          I[2][3] = I[2][3] / M[3][2];
          I[3][0] = I[3][0] / M[3][2];
          I[3][1] = I[3][1] / M[3][2];
          I[3][2] = I[3][2] / M[3][2];
          local_178 = (((1.0 / I[3][3]) / M[1][0]) / M[2][1]) / M[3][2];
          dVar4 = dVar4 * 2.220446049250313e-16;
          if (dVar4 < ABS(M[0][2])) {
            AddCxRow((double (*) [4])&x,-M[0][2],3,0);
          }
          if (dVar4 < ABS(M[1][2])) {
            AddCxRow((double (*) [4])&x,-M[1][2],3,1);
          }
          if (dVar4 < ABS(dVar3)) {
            AddCxRow((double (*) [4])&x,-dVar3,3,2);
          }
          if (local_16c % 2 != 0) {
            local_178 = -local_178;
          }
          *determinant = local_178;
        }
      }
    }
  }
  if (col[1] != 3) {
    SwapRow((double (*) [4])&x,3,col[1]);
  }
  if (col[0] != 2) {
    SwapRow((double (*) [4])&x,2,col[0]);
  }
  if (swapcount != 1) {
    SwapRow((double (*) [4])&x,1,swapcount);
  }
  if (rank != 0) {
    SwapRow((double (*) [4])&x,0,rank);
  }
  memcpy(dst,&x,0x80);
  return local_170;
}

Assistant:

static int Inv( const double* src, double dst[4][4], double* determinant, double* pivot )
{
  // returns rank (0, 1, 2, 3, or 4), inverse, and smallest pivot

	double M[4][4], I[4][4], x, c, d;
	int i, j, ix, jx;
  int col[4] = {0,1,2,3};
  int swapcount = 0;
  int rank = 0;

  *pivot = 0.0;
  *determinant = 0.0;

  memset( I, 0, sizeof(I) );
  I[0][0] = I[1][1] = I[2][2] = I[3][3] = 1.0;

  memcpy( M, src, sizeof(M) );

  // some loops unrolled for speed

  ix = jx = 0;
	x = fabs(M[0][0]);
  for ( i = 0; i < 4; i++ ) for ( j = 0; j < 4; j++ ) {
    if ( fabs(M[i][j]) > x ) {
      ix = i;
      jx = j;
      x = fabs(M[i][j]);
    }
  }
  *pivot = x;
  if ( ix != 0 ) {
    SwapRow( M, 0, ix );
    SwapRow( I, 0, ix );
    swapcount++;
  }
  if ( jx != 0 ) {
    SwapCol( M, 0, jx );
    col[0] = jx;
    swapcount++;
  }

  if ( x > 0.0 ) {
    rank++;

    // 17 August 2011 Dale Lear
    //   The result is slightly more accurate when using division
    //   instead of multiplying by the inverse of M[0][0]. If there
    //   is any speed penalty at this point in history, the accuracy
    //   is more important than the additional clocks.
    //c = d = 1.0/M[0][0];
    //M[0][1] *= c; M[0][2] *= c; M[0][3] *= c;
    //ScaleRow( I, c, 0 );
    c = M[0][0];
    M[0][1] /= c; M[0][2] /= c; M[0][3] /= c;
    I[0][0] /= c; I[0][1] /= c; I[0][2] /= c; I[0][3] /= c;
    d = 1.0/c;

    x *=  ON_EPSILON;

	  if (fabs(M[1][0]) > x) {
		  c = -M[1][0];
      M[1][1] += c*M[0][1]; M[1][2] += c*M[0][2]; M[1][3] += c*M[0][3];
      AddCxRow( I, c, 0, 1 );
	  }
	  if (fabs(M[2][0]) >  x) {
		  c = -M[2][0];
      M[2][1] += c*M[0][1]; M[2][2] += c*M[0][2]; M[2][3] += c*M[0][3];
      AddCxRow( I, c, 0, 2 );
	  }
	  if (fabs(M[3][0]) >  x) {
		  c = -M[3][0];
      M[3][1] += c*M[0][1]; M[3][2] += c*M[0][2]; M[3][3] += c*M[0][3];
      AddCxRow( I, c, 0, 3 );
	  }

    ix = jx = 1;
	  x = fabs(M[1][1]);
    for ( i = 1; i < 4; i++ ) for ( j = 1; j < 4; j++ ) {
      if ( fabs(M[i][j]) > x ) {
        ix = i;
        jx = j;
        x = fabs(M[i][j]);
      }
    }
    if ( x < *pivot )
      *pivot = x;
    if ( ix != 1 ) {
      SwapRow( M, 1, ix );
      SwapRow( I, 1, ix );
      swapcount++;
    }
    if ( jx != 1 ) {
      SwapCol( M, 1, jx );
      col[1] = jx;
      swapcount++;
    }
    if ( x > 0.0 ) {
      rank++;

      // 17 August 2011 Dale Lear
      //   The result is slightly more accurate when using division
      //   instead of multiplying by the inverse of M[1][1]. If there
      //   is any speed penalty at this point in history, the accuracy
      //   is more important than the additional clocks.
      //c = 1.0/M[1][1];
      //d *= c;
      //M[1][2] *= c; M[1][3] *= c;
      //ScaleRow( I, c, 1 );
      c = M[1][1];
      M[1][2] /= c; M[1][3] /= c;
      I[1][0] /= c; I[1][1] /= c; I[1][2] /= c; I[1][3] /= c;
      d /= c;

      x *= ON_EPSILON;
      if (fabs(M[0][1]) >  x) {
        c = -M[0][1];
        M[0][2] += c*M[1][2]; M[0][3] += c*M[1][3];
        AddCxRow( I, c, 1, 0 );
      }
      if (fabs(M[2][1]) >  x) {
        c = -M[2][1];
        M[2][2] += c*M[1][2]; M[2][3] += c*M[1][3];
        AddCxRow( I, c, 1, 2 );
      }
      if (fabs(M[3][1]) >  x) {
        c = -M[3][1];
        M[3][2] += c*M[1][2]; M[3][3] += c*M[1][3];
        AddCxRow( I, c, 1, 3 );
      }

      ix = jx = 2;
	    x = fabs(M[2][2]);
      for ( i = 2; i < 4; i++ ) for ( j = 2; j < 4; j++ ) {
        if ( fabs(M[i][j]) > x ) {
          ix = i;
          jx = j;
          x = fabs(M[i][j]);
        }
      }
      if ( x < *pivot )
        *pivot = x;
      if ( ix != 2 ) {
        SwapRow( M, 2, ix );
        SwapRow( I, 2, ix );
        swapcount++;
      }
      if ( jx != 2 ) {
        SwapCol( M, 2, jx );
        col[2] = jx;
        swapcount++;
      }
      if ( x > 0.0 ) {
        rank++;

        // 17 August 2011 Dale Lear
        //   The result is slightly more accurate when using division
        //   instead of multiplying by the inverse of M[2][2]. If there
        //   is any speed penalty at this point in history, the accuracy
        //   is more important than the additional clocks.
        //c = 1.0/M[2][2];
        //d *= c;
        //M[2][3] *= c;
        //ScaleRow( I, c, 2 );
        c = M[2][2];
        M[2][3] /= c;
        I[2][0] /= c; I[2][1] /= c; I[2][2] /= c; I[2][3] /= c;
        d /= c;

        x *= ON_EPSILON;
        if (fabs(M[0][2]) >  x) {
          c = -M[0][2];
          M[0][3] += c*M[2][3];
          AddCxRow( I, c, 2, 0 );
        }
        if (fabs(M[1][2]) >  x) {
          c = -M[1][2];
          M[1][3] += c*M[2][3];
          AddCxRow( I, c, 2, 1 );
        }
        if (fabs(M[3][2]) >  x) {
          c = -M[3][2];
          M[3][3] += c*M[2][3];
          AddCxRow( I, c, 2, 3 );
        }

        x = fabs(M[3][3]);
        if ( x < *pivot )
          *pivot = x;

        if ( x > 0.0 ) {
          rank++;

          // 17 August 2011 Dale Lear
          //   The result is slightly more accurate when using division
          //   instead of multiplying by the inverse of M[3][3]. If there
          //   is any speed penalty at this point in history, the accuracy
          //   is more important than the additional clocks.
          //c = 1.0/M[3][3];
          //d *= c;
          //ScaleRow( I, c, 3 );
          c = M[3][3];
          I[3][0] /= c; I[3][1] /= c; I[3][2] /= c; I[3][3] /= c;
          d /= c;

          x *= ON_EPSILON;
          if (fabs(M[0][3]) >  x) {
            AddCxRow( I, -M[0][3], 3, 0 );
          }
          if (fabs(M[1][3]) >  x) {
            AddCxRow( I, -M[1][3], 3, 1 );
          }
          if (fabs(M[2][3]) >  x) {
            AddCxRow( I, -M[2][3], 3, 2 );
          }

          *determinant = (swapcount%2) ? -d : d;
        }
      }
    }
  }

  if ( col[3] != 3 )
    SwapRow( I, 3, col[3] );
  if ( col[2] != 2 )
    SwapRow( I, 2, col[2] );
  if ( col[1] != 1 )
    SwapRow( I, 1, col[1] );
  if ( col[0] != 0 )
    SwapRow( I, 0, col[0] );

  memcpy( dst, I, sizeof(I) );
	return rank;
}